

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

void sesschan_start_backend(sesschan *sess,char *cmd)

{
  char *pcVar1;
  byte bVar2;
  Conf *pCVar3;
  char *pcVar4;
  LogContext *pLVar5;
  Seat *pSVar6;
  undefined1 *puVar7;
  Backend *pBVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  byte bVar12;
  undefined8 auStack_a88 [165];
  char *local_560;
  byte local_551;
  Conf *local_550;
  char *local_548;
  LogContext *local_540;
  Seat *local_538;
  undefined1 *local_530;
  undefined8 local_528 [161];
  undefined4 local_20;
  char *local_18;
  char *cmd_local;
  sesschan *sess_local;
  
  bVar12 = 0;
  local_538 = &sess->seat;
  local_540 = sess->child_logctx;
  local_550 = sess->conf;
  local_551 = sess->want_pty ^ 0xff;
  local_560 = sess->ssc->session_starting_dir;
  local_548 = cmd;
  local_18 = cmd;
  cmd_local = (char *)sess;
  memcpy(local_528,&sess->ttymodes,0x50c);
  pcVar4 = local_548;
  pCVar3 = local_550;
  bVar2 = local_551;
  pcVar1 = local_560;
  puVar10 = local_528;
  puVar11 = auStack_a88;
  local_530 = (undefined1 *)auStack_a88;
  for (lVar9 = 0xa1; puVar7 = local_530, pSVar6 = local_538, pLVar5 = local_540, lVar9 != 0;
      lVar9 = lVar9 + -1) {
    *puVar11 = *puVar10;
    puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
    puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
  }
  *(undefined4 *)(local_530 + 0x508) = local_20;
  *(char ***)(puVar7 + 0x518) = sesschan_start_backend::env_to_unset;
  *(char **)(puVar7 + 0x510) = pcVar1;
  pBVar8 = pty_backend_create(pSVar6,pLVar5,pCVar3,0,pcVar4,bVar2 & 1);
  *(Backend **)(cmd_local + 0x590) = pBVar8;
  backend_size(*(Backend **)(cmd_local + 0x590),*(int *)(cmd_local + 0x548),
               *(int *)(cmd_local + 0x54c));
  return;
}

Assistant:

static void sesschan_start_backend(sesschan *sess, const char *cmd)
{
    /*
     * List of environment variables that we should not pass through
     * from the login session Uppity was run in (which, it being a
     * test server, there will usually be one of). These variables
     * will be set as part of X or agent forwarding, and shouldn't be
     * confusingly set in the absence of that.
     *
     * (DISPLAY must also be cleared, but pty.c will do that anyway
     * when our get_x_display method returns NULL.)
     */
    static const char *const env_to_unset[] = {
        "XAUTHORITY", "SSH_AUTH_SOCK", "SSH_AGENT_PID",
        NULL /* terminator */
    };

    sess->backend = pty_backend_create(
        &sess->seat, sess->child_logctx, sess->conf, NULL, cmd,
        sess->ttymodes, !sess->want_pty, sess->ssc->session_starting_dir,
        env_to_unset);
    backend_size(sess->backend, sess->wc, sess->hc);
}